

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPool.cpp
# Opt level: O2

VkResult __thiscall
myvk::QueryPool::GetResults64(QueryPool *this,uint64_t *data,VkQueryResultFlags flags)

{
  VkResult VVar1;
  
  VVar1 = GetResults64(this,0,this->m_count,data,flags);
  return VVar1;
}

Assistant:

VkResult QueryPool::GetResults64(uint64_t *data, VkQueryResultFlags flags) const {
	return GetResults64(0, m_count, data, flags);
}